

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

String * kj::_::operator*(String *__return_storage_ptr__,uchar *param_2,undefined8 param_3,
                         undefined8 param_4,CappedArray<char,_5UL> *param_5)

{
  CappedArray<char,_5UL> CVar1;
  StringPtr local_40;
  size_t local_30;
  undefined4 local_28;
  char local_24;
  
  CVar1 = Stringifier::operator*((Stringifier *)&STR,*param_2);
  local_30 = CVar1.currentSize;
  local_28 = CVar1.content._0_4_;
  local_24 = CVar1.content[4];
  CVar1 = Stringifier::operator*((Stringifier *)&STR,param_2[1]);
  local_40.content.ptr = (char *)CVar1.currentSize;
  local_40.content.size_._0_4_ = CVar1.content._0_4_;
  local_40.content.size_._4_1_ = CVar1.content[4];
  concat<kj::CappedArray<char,5ul>,kj::StringPtr&,kj::CappedArray<char,5ul>>
            (__return_storage_ptr__,(_ *)&local_30,(CappedArray<char,_5UL> *)(param_2 + 8),&local_40
             ,param_5);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}